

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

matches * atomname(disctx *ctx,ull *a,ull *m,void *v,int spos)

{
  int iVar1;
  expr *peVar2;
  void *pvVar3;
  disctx *in_RCX;
  long in_RDI;
  etype in_R8D;
  expr *expr;
  char *in_stack_ffffffffffffffc8;
  matches *local_8;
  
  if (*(int *)(in_RDI + 0x48) == 0) {
    peVar2 = makeex(in_R8D);
    peVar2->str = (char *)in_RCX;
    if (*(int *)(in_RDI + 0x74) <= *(int *)(in_RDI + 0x70)) {
      if (*(int *)(in_RDI + 0x74) == 0) {
        *(undefined4 *)(in_RDI + 0x74) = 0x10;
      }
      else {
        *(int *)(in_RDI + 0x74) = *(int *)(in_RDI + 0x74) << 1;
      }
      pvVar3 = realloc(*(void **)(in_RDI + 0x68),(long)*(int *)(in_RDI + 0x74) << 3);
      *(void **)(in_RDI + 0x68) = pvVar3;
    }
    iVar1 = *(int *)(in_RDI + 0x70);
    *(int *)(in_RDI + 0x70) = iVar1 + 1;
    *(expr **)(*(long *)(in_RDI + 0x68) + (long)iVar1 * 8) = peVar2;
    local_8 = (matches *)0x0;
  }
  else {
    local_8 = matchid(in_RCX,in_R8D,in_stack_ffffffffffffffc8);
  }
  return local_8;
}

Assistant:

struct matches *atomname APROTO {
	if (!ctx->reverse) {
		struct expr *expr = makeex(EXPR_ID);
		expr->str = v;
		ADDARRAY(ctx->atoms, expr);
		return NULL;
	} else {
		return matchid(ctx, spos, v);
	}
}